

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O2

void json::JsonDocument::writeNode(ostream *output,JsonNode *node,string *indent,size_t tabSize)

{
  bool bVar1;
  int iVar2;
  JsonArray *this;
  JsonNode *pJVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar5;
  undefined4 extraout_var_01;
  bool *pbVar6;
  JsonObject *this_00;
  ostream *poVar7;
  undefined4 extraout_var_02;
  char *pcVar8;
  const_iterator cVar9;
  const_iterator __begin3;
  pointer local_b8;
  undefined1 local_b0 [16];
  JsonObject *local_a0;
  string newIndent;
  const_iterator __end3;
  string local_70;
  string local_50;
  
  iVar2 = (*node->_vptr_JsonNode[2])(node);
  switch(iVar2) {
  case 0:
    this = JsonNode::operator_cast_to_JsonArray_(node);
    std::operator<<(output,'[');
    bVar1 = JsonArray::empty(this);
    if (!bVar1) {
      std::operator<<(output,'\n');
    }
    __begin3.it._M_current = (const_iterator)local_b0;
    std::__cxx11::string::_M_construct((ulong)&__begin3,(char)tabSize);
    std::operator+(&newIndent,indent,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3);
    std::__cxx11::string::~string((string *)&__begin3);
    __begin3.it._M_current = (const_iterator)JsonArray::begin(this);
    __end3.it._M_current = (const_iterator)JsonArray::end(this);
    while (bVar1 = JsonArray::const_iterator::operator!=(&__begin3,&__end3), bVar1) {
      pJVar3 = JsonArray::const_iterator::operator*(&__begin3);
      std::operator<<(output,(string *)&newIndent);
      std::__cxx11::string::string((string *)&local_50,(string *)&newIndent);
      writeNode(output,pJVar3,&local_50,tabSize);
      std::__cxx11::string::~string((string *)&local_50);
      sVar4 = JsonArray::getChildCount(this);
      iVar2 = (*(this->super_JsonNode)._vptr_JsonNode[0x10])(this,sVar4 - 1);
      if (pJVar3 != (JsonNode *)CONCAT44(extraout_var,iVar2)) {
        std::operator<<(output,',');
      }
      std::operator<<(output,'\n');
      JsonArray::const_iterator::operator++(&__begin3);
    }
    bVar1 = JsonArray::empty(this);
    if (!bVar1) {
      std::operator<<(output,(string *)indent);
    }
    std::operator<<(output,']');
    break;
  case 1:
    this_00 = JsonNode::operator_cast_to_JsonObject_(node);
    std::operator<<(output,'{');
    local_a0 = this_00;
    bVar1 = JsonObject::empty(this_00);
    if (!bVar1) {
      std::operator<<(output,'\n');
    }
    __begin3.it._M_current = (const_iterator)local_b0;
    std::__cxx11::string::_M_construct((ulong)&__begin3,(char)tabSize);
    std::operator+(&newIndent,indent,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3);
    std::__cxx11::string::~string((string *)&__begin3);
    JsonObject::sort_abi_cxx11_
              ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                *)&__begin3,local_a0);
    for (cVar9._M_current =
              (unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> *)__begin3;
        (pointer)cVar9._M_current != local_b8; cVar9._M_current = cVar9._M_current + 2) {
      poVar7 = std::operator<<(output,(string *)&newIndent);
      poVar7 = std::operator<<(poVar7,'\"');
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((cVar9._M_current)->_M_t).
                                      super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>
                                      .super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl);
      poVar7 = std::operator<<(poVar7,'\"');
      std::operator<<(poVar7,": ");
      pJVar3 = cVar9._M_current[1]._M_t.
               super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
               super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
               super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl;
      std::__cxx11::string::string((string *)&local_70,(string *)&newIndent);
      writeNode(output,pJVar3,&local_70,tabSize);
      std::__cxx11::string::~string((string *)&local_70);
      if (cVar9._M_current[1]._M_t.
          super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
          super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
          super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl != local_b8[-1].second) {
        std::operator<<(output,',');
      }
      std::operator<<(output,'\n');
    }
    bVar1 = JsonObject::empty(local_a0);
    if (!bVar1) {
      std::operator<<(output,(string *)indent);
    }
    std::operator<<(output,'}');
    std::
    _Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ::~_Vector_base((_Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                     *)&__begin3);
    break;
  case 2:
    iVar2 = (*node->_vptr_JsonNode[8])(node);
    pbVar6 = JsonBool::operator_cast_to_bool_((JsonBool *)CONCAT44(extraout_var_01,iVar2));
    pcVar8 = "false";
    if (*pbVar6 != false) {
      pcVar8 = "true";
    }
    goto LAB_00103e29;
  case 3:
    pcVar8 = "null";
LAB_00103e29:
    std::operator<<(output,pcVar8);
    return;
  case 4:
    iVar2 = (*node->_vptr_JsonNode[0xc])(node);
    pdVar5 = JsonNumber::operator_cast_to_double_((JsonNumber *)CONCAT44(extraout_var_00,iVar2));
    std::ostream::_M_insert<double>(*pdVar5);
    return;
  case 5:
    poVar7 = std::operator<<(output,'\"');
    iVar2 = (*node->_vptr_JsonNode[0xe])(node);
    JsonString::escaped_abi_cxx11_(&newIndent,(JsonString *)CONCAT44(extraout_var_02,iVar2));
    poVar7 = std::operator<<(poVar7,(string *)&newIndent);
    std::operator<<(poVar7,'\"');
    break;
  default:
    goto switchD_00103ca3_default;
  }
  std::__cxx11::string::~string((string *)&newIndent);
switchD_00103ca3_default:
  return;
}

Assistant:

void JsonDocument::writeNode(std::ostream &output, const JsonNode &node, std::string indent, size_t tabSize)
    {
        switch (node.getType())
        {
        case JsonNodeType::Array:
        {
            const JsonArray &array = node;

            output << '[';

            // If the array is empty we would like to print [] without a newline in the middle.
            if (!array.empty())
                output << '\n';

            // Calculate new indent for child nodes.
            std::string newIndent = indent + std::string(tabSize, ' ');

            for (const JsonNode &child : array)
            {
                output << newIndent;
                writeNode(output, child, newIndent, tabSize);
                if (&child != &array[array.getChildCount() - 1]) // If last child don't print ','.
                    output << ',';
                output << '\n';
            }

            // Same reasoning as previous array.empty() check, we don't want spaces in the middle of [].
            if (!array.empty())
                output << indent;

            output << ']';
        }
        break;
        case JsonNodeType::Object:
        {
            const JsonObject &object = node;
            output << '{';

            if (!object.empty())
                output << '\n';

            std::string newIndent = indent + std::string(tabSize, ' ');

            // We want the pairs to be printed based on the insertion order therefore we sort the object first.
            // This is not necessary and will have a performance cost, but it's pretty and therefore we do it.
            std::vector<std::pair<const std::string &, const JsonNode &>> children = object.sort();
            for (const auto &pair : children)
            {
                output << newIndent << '\"' << pair.first << '\"' << ": ";
                writeNode(output, pair.second, newIndent, tabSize);
                if (&pair.second != &children[children.size() - 1].second)
                    output << ',';
                output << '\n';
            }

            if (!object.empty())
                output << indent;

            output << '}';
        }
        break;
        case JsonNodeType::Bool:
            output << (node.toBool() ? "true" : "false");
            break;
        case JsonNodeType::Null:
            output << "null";
            break;
        case JsonNodeType::Number:
            output << node.toNumber();
            break;
        case JsonNodeType::String:
            output << '\"' << node.toString().escaped() << '\"';
            break;
        }
    }